

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateObjectReference(cJSON *child)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON *item;
  cJSON *child_local;
  
  pcVar1 = cJSON_New_Item(&global_hooks);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->type = 0x140;
    pcVar2 = (cJSON *)cast_away_const(child);
    pcVar1->child = pcVar2;
  }
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateObjectReference(const cJSON *child)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if (item != NULL) {
        item->type = cJSON_Object | cJSON_IsReference;
        item->child = (cJSON*)cast_away_const(child);
    }

    return item;
}